

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_free(anm_archive_t *anm)

{
  uchar *puVar1;
  long *__ptr;
  undefined8 *__ptr_00;
  void *__ptr_01;
  undefined8 *puVar2;
  undefined8 *puVar3;
  list_node_t *plVar4;
  
  puVar1 = anm->map;
  for (plVar4 = (anm->names).head; plVar4 != (list_node_t *)0x0; plVar4 = plVar4->next) {
    free(plVar4->data);
  }
  list_free_nodes(&anm->names);
  plVar4 = (anm->entries).head;
  do {
    if (plVar4 == (list_node_t *)0x0) {
      list_free_nodes(&anm->entries);
      if (puVar1 != (uchar *)0x0) {
        file_munmap(anm->map,anm->map_size);
      }
      free(anm);
      return;
    }
    __ptr = (long *)plVar4->data;
    list_free_nodes((list_t *)(__ptr + 4));
    for (puVar3 = (undefined8 *)__ptr[6]; puVar3 != (undefined8 *)0x0;
        puVar3 = (undefined8 *)*puVar3) {
      __ptr_00 = (undefined8 *)puVar3[2];
      if (puVar1 == (uchar *)0x0) {
        free((void *)*__ptr_00);
LAB_00107b52:
        for (puVar2 = (undefined8 *)__ptr_00[1]; puVar2 != (undefined8 *)0x0;
            puVar2 = (undefined8 *)*puVar2) {
          free((void *)puVar2[2]);
        }
      }
      else if (*(int *)(*__ptr + 0x28) == 0) goto LAB_00107b52;
      list_free_nodes((list_t *)(__ptr_00 + 1));
      free(__ptr_00);
    }
    list_free_nodes((list_t *)(__ptr + 6));
    __ptr_01 = (void *)*__ptr;
    if (puVar1 == (uchar *)0x0) {
      free(__ptr_01);
      free((void *)__ptr[1]);
      free((void *)__ptr[3]);
      free((void *)__ptr[8]);
      for (puVar3 = (undefined8 *)__ptr[4]; puVar3 != (undefined8 *)0x0;
          puVar3 = (undefined8 *)*puVar3) {
        free((void *)puVar3[2]);
      }
    }
    else if (6 < *(uint *)((long)__ptr_01 + 0x28)) {
      free(__ptr_01);
    }
    free(__ptr);
    plVar4 = plVar4->next;
  } while( true );
}

Assistant:

static void
anm_free(
    anm_archive_t* anm)
{
    int is_mapped = anm->map != NULL;

    char* name;
    list_for_each(&anm->names, name)
        free(name);
    list_free_nodes(&anm->names);

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        list_free_nodes(&entry->sprites);

        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            if (!is_mapped)
                free(script->offset);

            if (!is_mapped || entry->header->version == 0) {
                anm_instr_t* instr;
                list_for_each(&script->instrs, instr) {
                    free(instr);
                }
            }
            list_free_nodes(&script->instrs);

            free(script);
        }
        list_free_nodes(&entry->scripts);

        if (!is_mapped) {
            free(entry->header);
            free(entry->thtx);
            free(entry->name2);
            free(entry->data);

            sprite_t* sprite;
            list_for_each(&entry->sprites, sprite)
                free(sprite);
        } else if (entry->header->version >= 7) {
            free(entry->header);
        }

        free(entry);
    }
    list_free_nodes(&anm->entries);

    if (is_mapped)
        file_munmap(anm->map, anm->map_size);

    free(anm);
}